

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::clear
          (array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_> *this)

{
  CCommand *pCVar1;
  
  allocator_default<CCommandManager::CCommand>::free_array(this->list);
  this->list_size = 1;
  pCVar1 = allocator_default<CCommandManager::CCommand>::alloc_array(1);
  this->list = pCVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}